

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O1

bool __thiscall
BibIndexer::getEntryKey
          (BibIndexer *this,u16string *keyName,TSNode *entryNode,uint32_t *index,uint32_t childCount
          )

{
  TSNode self;
  TSSymbol TVar1;
  uint child_index;
  bool bVar2;
  TSNode node;
  string local_78;
  u16string *local_58;
  u16string local_50;
  
  child_index = *index;
  bVar2 = child_index < childCount;
  local_58 = keyName;
  if (bVar2) {
    do {
      ts_node_named_child((TSNode *)&local_78,*entryNode,child_index);
      self.context[2] = (undefined4)local_78._M_string_length;
      self.context[3] = local_78._M_string_length._4_4_;
      self.context._0_8_ = local_78._M_dataplus._M_p;
      self.id = (void *)local_78.field_2._M_allocated_capacity;
      self.tree = (TSTree *)local_78.field_2._8_8_;
      TVar1 = ts_node_symbol(self);
      if (TVar1 == 0x1f) {
        File::textForNode_abi_cxx11_(&local_50,this->file,(TSNode *)&local_78);
        std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::operator=(local_58,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return bVar2;
        }
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 2 + 2);
        return bVar2;
      }
      child_index = *index + 1;
      *index = child_index;
      bVar2 = child_index < childCount;
    } while (bVar2);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Missign key name","");
  addLint(this,entryNode,Error,4,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool BibIndexer::getEntryKey (u16string &keyName, TSNode &entryNode, uint32_t &index, uint32_t childCount) {
    for (; index < childCount; index++) {
        TSNode node = ts_node_named_child(entryNode, index);
        switch (ts_node_symbol(node)) {
            case SymKey:
                keyName = file->textForNode(node);
                return true;
            default: {}
        }
    }

    addError(entryNode, Error::MissingKeyName, "Missign key name");
    return false;
}